

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void __thiscall slang::SourceManager::addSystemDirectory(SourceManager *this,string_view path)

{
  unique_lock<std::shared_mutex> lock;
  path local_78;
  path local_50;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  std::unique_lock<std::shared_mutex>::unique_lock(&lock,&this->mut);
  local_28._M_len = path._M_len;
  local_28._M_str = path._M_str;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_78,&local_28,auto_format);
  std::filesystem::canonical(&local_50);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  emplace_back<std::filesystem::__cxx11::path>(&this->systemDirectories,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::filesystem::__cxx11::path::~path(&local_78);
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void SourceManager::addSystemDirectory(string_view path) {
    std::unique_lock lock(mut);
    systemDirectories.push_back(fs::canonical(widen(path)));
}